

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

int Ssw_RarManObjWhichOne(Ssw_RarMan_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  word *pwVar2;
  ulong uVar3;
  ulong uVar4;
  
  pwVar2 = Ssw_RarObjSim(p,pObj->Id);
  uVar1 = p->pPars->nWords;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  while( true ) {
    if (uVar3 * 0x40 == uVar4) {
      return -1;
    }
    if (*pwVar2 != 0) break;
    uVar4 = uVar4 + 0x40;
    pwVar2 = pwVar2 + 1;
  }
  uVar3 = 0;
  uVar4 = uVar4 & 0xffffffff;
  while( true ) {
    if (uVar3 == 0x40) {
      __assert_fail("i < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                    ,0x244,"int Ssw_RarManObjWhichOne(Ssw_RarMan_t *, Aig_Obj_t *)");
    }
    if ((*pwVar2 >> (uVar3 & 0x3f) & 1) != 0) break;
    uVar3 = uVar3 + 1;
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  return (int)uVar4;
}

Assistant:

int Ssw_RarManObjWhichOne( Ssw_RarMan_t * p, Aig_Obj_t * pObj )
{
    word * pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    word Flip = 0;//pObj->fPhase ? ~(word)0 : 0; // bug fix!
    int w, i;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim[w] ^ Flip )
        {
            for ( i = 0; i < 64; i++ )
                if ( ((pSim[w] ^ Flip) >> i) & 1 )
                    break;
            assert( i < 64 );
            return w * 64 + i;
        }
    return -1;
}